

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float128 float128_mul_mipsel(float128 a,float128 b,float_status *status)

{
  byte zSign;
  uint64_t uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int32_t zExp;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  float128 fVar16;
  int32_t bExp;
  int32_t aExp;
  uint64_t bSig1;
  uint64_t bSig0;
  uint64_t aSig0;
  uint32_t aLow;
  uint64_t aSig1;
  uint local_98;
  uint local_94;
  ulong local_90;
  uint64_t local_88;
  ulong local_80;
  ulong local_78;
  float_status *local_70;
  ulong local_68;
  ulong local_60;
  uint64_t local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_58 = a.low;
  uVar1 = b.low;
  local_78 = a.high & 0xffffffffffff;
  local_94 = a.high._6_2_ & 0x7fff;
  uVar12 = b.high & 0xffffffffffff;
  local_98 = b.high._6_2_ & 0x7fff;
  uVar6 = b.high ^ a.high;
  local_88 = uVar1;
  local_80 = uVar12;
  if (local_94 == 0x7fff) {
    if ((((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
         local_58 != 0) ||
       ((((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        uVar1 != 0) && local_98 == 0x7fff)) {
LAB_007cf43b:
      fVar16 = propagateFloat128NaN(a,b,status);
      return fVar16;
    }
    if ((((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0 &&
        uVar1 == 0) &&
        ((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0) {
LAB_007cf6b5:
      status->float_exception_flags = status->float_exception_flags | 1;
      uVar6 = 0x2000000000000000;
      if (status->snan_bit_is_one != '\0') {
        uVar6 = 0x1fffffffffffffff;
      }
      uVar1 = -(ulong)((uint)uVar6 & 1);
      uVar6 = uVar6 >> 0xe | 0x7fff000000000000;
      goto LAB_007cf722;
    }
  }
  else {
    if (local_98 != 0x7fff) {
      if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
        if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
            local_58 != 0) {
          normalizeFloat128Subnormal(local_78,local_58,(int32_t *)&local_94,&local_78,&local_58);
          goto LAB_007cf47f;
        }
      }
      else {
LAB_007cf47f:
        if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) != (undefined1  [16])0x0) {
LAB_007cf4a7:
          uVar10 = local_78 | 0x1000000000000;
          uVar12 = local_80 << 0x10;
          uVar5 = local_88 >> 0x30;
          local_80 = uVar12 | uVar5;
          local_88 = local_88 * 0x10000;
          uVar9 = local_58 >> 0x20;
          local_40 = local_88 >> 0x20;
          local_68 = local_58;
          uVar3 = (local_58 & 0xffffffff) * local_40;
          uVar13 = uVar9 * (local_88 & 0xffffffff);
          uVar14 = uVar13 + uVar3;
          local_60 = local_58 * local_88;
          uVar4 = uVar12 >> 0x20;
          uVar2 = (local_58 & 0xffffffff) * uVar4;
          uVar5 = uVar12 & 0xffffffff | uVar5;
          uVar7 = uVar9 * uVar5;
          uVar8 = uVar7 + uVar2;
          local_50 = uVar8 >> 0x20;
          uVar12 = local_58 * local_80;
          local_48 = (ulong)(uVar12 < uVar8 << 0x20);
          uVar13 = uVar9 * local_40 + uVar12 + (uVar14 >> 0x20) +
                   ((ulong)CARRY8(uVar13,uVar3) << 0x20) + (ulong)(local_60 < uVar14 << 0x20);
          uVar15 = uVar10 >> 0x20;
          uVar3 = uVar4 * (local_78 & 0xffffffff);
          uVar5 = uVar5 * uVar15;
          uVar8 = uVar5 + uVar3;
          uVar11 = local_80 * uVar10;
          local_90 = (ulong)(uVar11 < uVar8 << 0x20);
          uVar14 = uVar9 * uVar4 + uVar11 + local_50 + ((ulong)CARRY8(uVar7,uVar2) << 0x20) +
                   local_48 + (ulong)(uVar13 < uVar12);
          uVar12 = (local_78 & 0xffffffff) * local_40;
          uVar2 = (local_88 & 0xffffffff) * uVar15;
          uVar7 = uVar2 + uVar12;
          uVar9 = local_88 * uVar10;
          uVar2 = (uVar7 >> 0x20) + uVar15 * local_40 + ((ulong)CARRY8(uVar2,uVar12) << 0x20) +
                  (ulong)(uVar9 < uVar7 << 0x20) + (ulong)CARRY8(uVar9,uVar13);
          uVar7 = uVar2 + uVar14;
          uVar12 = uVar7 + local_58;
          uVar1 = uVar4 * uVar15 + uVar10 + (uVar8 >> 0x20) + ((ulong)CARRY8(uVar5,uVar3) << 0x20) +
                  local_90 + (ulong)(uVar14 < uVar11) + (ulong)CARRY8(uVar2,uVar14) +
                  (ulong)CARRY8(uVar7,local_58);
          uVar5 = (ulong)(local_60 != 0) | uVar9 + uVar13;
          if (uVar1 >> 0x31 == 0) {
            zExp = local_98 + local_94 + -0x4000;
          }
          else {
            uVar2 = uVar1 << 0x3f;
            uVar1 = uVar1 >> 1;
            uVar5 = (ulong)(uVar5 != 0) | uVar12 << 0x3f;
            zExp = local_98 + local_94 + -0x3fff;
            uVar12 = uVar2 | uVar12 >> 1;
          }
          local_38._0_1_ = (byte)(uVar6 >> 0x3f);
          zSign = (byte)local_38;
          local_78 = uVar10;
          local_70 = status;
          local_38 = uVar6 >> 0x3f;
          fVar16 = roundAndPackFloat128(zSign,zExp,uVar1,uVar12,uVar5,status);
          return fVar16;
        }
        if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
            uVar1 != 0) {
          normalizeFloat128Subnormal(uVar12,uVar1,(int32_t *)&local_98,&local_80,&local_88);
          goto LAB_007cf4a7;
        }
      }
      uVar6 = uVar6 & 0x8000000000000000;
      uVar1 = 0;
      goto LAB_007cf722;
    }
    if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        uVar1 != 0) goto LAB_007cf43b;
    if ((((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0 &&
        local_58 == 0) &&
        ((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0)
    goto LAB_007cf6b5;
  }
  uVar6 = uVar6 & 0x8000000000000000 | 0x7fff000000000000;
  uVar1 = 0;
LAB_007cf722:
  fVar16.high = uVar6;
  fVar16.low = uVar1;
  return fVar16;
}

Assistant:

float128 float128_mul(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig0, aSig1, bSig0, bSig1, zSig0, zSig1, zSig2, zSig3;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    bSign = extractFloat128Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if (    ( aSig0 | aSig1 )
             || ( ( bExp == 0x7FFF ) && ( bSig0 | bSig1 ) ) ) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( ( bExp | bSig0 | bSig1 ) == 0 ) goto invalid;
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( ( aExp | aSig0 | aSig1 ) == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return float128_default_nan(status);
        }
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    zExp = aExp + bExp - 0x4000;
    aSig0 |= UINT64_C(0x0001000000000000);
    shortShift128Left( bSig0, bSig1, 16, &bSig0, &bSig1 );
    mul128To256( aSig0, aSig1, bSig0, bSig1, &zSig0, &zSig1, &zSig2, &zSig3 );
    add128( zSig0, zSig1, aSig0, aSig1, &zSig0, &zSig1 );
    zSig2 |= ( zSig3 != 0 );
    if (UINT64_C( 0x0002000000000000) <= zSig0 ) {
        shift128ExtraRightJamming(
            zSig0, zSig1, zSig2, 1, &zSig0, &zSig1, &zSig2 );
        ++zExp;
    }
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}